

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CppType *pCVar4;
  CppType *pCVar5;
  LogMessage local_b8;
  Voidify local_a1;
  CppType local_a0;
  CppType local_9c;
  Nullable<const_char_*> local_98;
  LogMessage local_90;
  Voidify local_79;
  anon_enum_32 local_78;
  anon_enum_32 local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    bVar1 = MaybeNewExtension(this,number,descriptor,
                              (Extension **)&absl_log_internal_check_op_result);
    if (bVar1) {
      absl_log_internal_check_op_result[8] = descriptor_local._3_1_;
      local_3c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
      pCVar4 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_3c)
      ;
      local_40 = CPPTYPE_MESSAGE;
      pCVar5 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_40)
      ;
      local_38 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                           (pCVar4,pCVar5,
                            "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_38 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2ee,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      absl_log_internal_check_op_result[9] = '\0';
      absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
      absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfb;
      *(Extension **)absl_log_internal_check_op_result = extension;
    }
    else {
      local_74 = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
      v1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_74);
      local_78 = OPTIONAL_FIELD;
      v2 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_78);
      local_70 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                           (v1,v2,
                            "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                           );
      if (local_70 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2f4,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      local_9c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
      pCVar4 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_9c)
      ;
      local_a0 = CPPTYPE_MESSAGE;
      pCVar5 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a0)
      ;
      local_98 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                           (pCVar4,pCVar5,
                            "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_98 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2f4,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
        if ((this->arena_ == (Arena *)0x0) &&
           (*(long **)absl_log_internal_check_op_result != (long *)0x0)) {
          (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
        }
        *(Extension **)absl_log_internal_check_op_result = extension;
      }
      else {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 0x38))
                  (*(long **)absl_log_internal_check_op_result,extension,this->arena_);
      }
    }
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}